

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

DefaultClockingReferenceSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DefaultClockingReferenceSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,Token *args_2,Token *args_3,Token *args_4)

{
  Token clocking;
  Token defaultKeyword;
  DefaultClockingReferenceSyntax *pDVar1;
  Token *in_RCX;
  Token *in_RDX;
  undefined8 *in_R8;
  undefined8 *in_R9;
  size_t in_stack_ffffffffffffff78;
  size_t in_stack_ffffffffffffff80;
  BumpAllocator *in_stack_ffffffffffffff88;
  
  pDVar1 = (DefaultClockingReferenceSyntax *)
           allocate(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  defaultKeyword.info = (Info *)*in_R8;
  defaultKeyword._0_8_ = (DefaultClockingReferenceSyntax *)in_R9[1];
  clocking.info = (Info *)*in_R9;
  clocking._0_8_ = pDVar1;
  slang::syntax::DefaultClockingReferenceSyntax::DefaultClockingReferenceSyntax
            ((DefaultClockingReferenceSyntax *)in_R9[1],
             (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)*in_R9,defaultKeyword,clocking,
             *in_RCX,*in_RDX);
  return pDVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }